

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapePermuteLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  size_t sVar1;
  size_t sVar2;
  undefined7 uVar3;
  bool bVar4;
  undefined7 uVar5;
  pointer pSVar6;
  string *psVar7;
  ShapeRange *pSVar8;
  reference pvVar9;
  PermuteLayerParams *from;
  uint64 __n;
  uint64 __n_00;
  uint64 __n_01;
  uint64 __n_02;
  mapped_type *this_00;
  allocator<CoreML::ShapeRange> local_b9;
  undefined1 local_b8 [8];
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> outranges;
  ShapeConstraint *outputShape;
  size_t axis3;
  size_t axis2;
  size_t axis1;
  size_t axis0;
  PermuteLayerParams permute;
  allocator<CoreML::ShapeRange> local_39;
  undefined1 local_38 [8];
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> ranges;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  psVar7 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
        ::operator[](&this->blobShapes,psVar7)->_sequenceRange;
  std::allocator<CoreML::ShapeRange>::allocator(&local_39);
  std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::vector
            ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_38,4,&local_39
            );
  std::allocator<CoreML::ShapeRange>::~allocator(&local_39);
  pSVar8 = ShapeConstraint::sequenceRange
                     ((ShapeConstraint *)
                      ranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_38,0)
  ;
  bVar4 = (pSVar8->_minimum)._isUnbound;
  uVar5 = *(undefined7 *)&(pSVar8->_minimum).field_0x1;
  sVar1 = (pSVar8->_minimum)._val;
  uVar3 = *(undefined7 *)&(pSVar8->_maximum).field_0x1;
  sVar2 = (pSVar8->_maximum)._val;
  (pvVar9->_maximum)._isUnbound = (pSVar8->_maximum)._isUnbound;
  *(undefined7 *)&(pvVar9->_maximum).field_0x1 = uVar3;
  (pvVar9->_maximum)._val = sVar2;
  (pvVar9->_minimum)._isUnbound = bVar4;
  *(undefined7 *)&(pvVar9->_minimum).field_0x1 = uVar5;
  (pvVar9->_minimum)._val = sVar1;
  pSVar8 = ShapeConstraint::channelRange
                     ((ShapeConstraint *)
                      ranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_38,1)
  ;
  bVar4 = (pSVar8->_minimum)._isUnbound;
  uVar5 = *(undefined7 *)&(pSVar8->_minimum).field_0x1;
  sVar1 = (pSVar8->_minimum)._val;
  uVar3 = *(undefined7 *)&(pSVar8->_maximum).field_0x1;
  sVar2 = (pSVar8->_maximum)._val;
  (pvVar9->_maximum)._isUnbound = (pSVar8->_maximum)._isUnbound;
  *(undefined7 *)&(pvVar9->_maximum).field_0x1 = uVar3;
  (pvVar9->_maximum)._val = sVar2;
  (pvVar9->_minimum)._isUnbound = bVar4;
  *(undefined7 *)&(pvVar9->_minimum).field_0x1 = uVar5;
  (pvVar9->_minimum)._val = sVar1;
  pSVar8 = ShapeConstraint::heightRange
                     ((ShapeConstraint *)
                      ranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_38,2)
  ;
  bVar4 = (pSVar8->_minimum)._isUnbound;
  uVar5 = *(undefined7 *)&(pSVar8->_minimum).field_0x1;
  sVar1 = (pSVar8->_minimum)._val;
  uVar3 = *(undefined7 *)&(pSVar8->_maximum).field_0x1;
  sVar2 = (pSVar8->_maximum)._val;
  (pvVar9->_maximum)._isUnbound = (pSVar8->_maximum)._isUnbound;
  *(undefined7 *)&(pvVar9->_maximum).field_0x1 = uVar3;
  (pvVar9->_maximum)._val = sVar2;
  (pvVar9->_minimum)._isUnbound = bVar4;
  *(undefined7 *)&(pvVar9->_minimum).field_0x1 = uVar5;
  (pvVar9->_minimum)._val = sVar1;
  pSVar8 = ShapeConstraint::widthRange
                     ((ShapeConstraint *)
                      ranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_38,3)
  ;
  bVar4 = (pSVar8->_minimum)._isUnbound;
  uVar5 = *(undefined7 *)&(pSVar8->_minimum).field_0x1;
  sVar1 = (pSVar8->_minimum)._val;
  uVar3 = *(undefined7 *)&(pSVar8->_maximum).field_0x1;
  sVar2 = (pSVar8->_maximum)._val;
  (pvVar9->_maximum)._isUnbound = (pSVar8->_maximum)._isUnbound;
  *(undefined7 *)&(pvVar9->_maximum).field_0x1 = uVar3;
  (pvVar9->_maximum)._val = sVar2;
  (pvVar9->_minimum)._isUnbound = bVar4;
  *(undefined7 *)&(pvVar9->_minimum).field_0x1 = uVar5;
  (pvVar9->_minimum)._val = sVar1;
  from = Specification::NeuralNetworkLayer::permute(specLayer);
  Specification::PermuteLayerParams::PermuteLayerParams((PermuteLayerParams *)&axis0,from);
  __n = Specification::PermuteLayerParams::axis((PermuteLayerParams *)&axis0,0);
  __n_00 = Specification::PermuteLayerParams::axis((PermuteLayerParams *)&axis0,1);
  __n_01 = Specification::PermuteLayerParams::axis((PermuteLayerParams *)&axis0,2);
  __n_02 = Specification::PermuteLayerParams::axis((PermuteLayerParams *)&axis0,3);
  psVar7 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar7);
  outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &this_00->_sequenceRange;
  psVar7 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName(this_00,psVar7);
  pSVar6 = outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar7 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName((ShapeConstraint *)pSVar6,psVar7);
  pSVar6 = outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_38,
                      __n);
  ShapeConstraint::updateSequenceRange((ShapeConstraint *)pSVar6,pvVar9);
  pSVar6 = outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_38,
                      __n_00);
  ShapeConstraint::updateChannelRange((ShapeConstraint *)pSVar6,pvVar9);
  pSVar6 = outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_38,
                      __n_01);
  ShapeConstraint::updateHeightRange((ShapeConstraint *)pSVar6,pvVar9);
  pSVar6 = outranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_38,
                      __n_02);
  ShapeConstraint::updateWidthRange((ShapeConstraint *)pSVar6,pvVar9);
  std::allocator<CoreML::ShapeRange>::allocator(&local_b9);
  std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::vector
            ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b8,4,&local_b9
            );
  std::allocator<CoreML::ShapeRange>::~allocator(&local_b9);
  pSVar8 = ShapeConstraint::sequenceRange
                     ((ShapeConstraint *)
                      outranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b8,
                      __n);
  bVar4 = (pSVar8->_minimum)._isUnbound;
  uVar5 = *(undefined7 *)&(pSVar8->_minimum).field_0x1;
  sVar1 = (pSVar8->_minimum)._val;
  uVar3 = *(undefined7 *)&(pSVar8->_maximum).field_0x1;
  sVar2 = (pSVar8->_maximum)._val;
  (pvVar9->_maximum)._isUnbound = (pSVar8->_maximum)._isUnbound;
  *(undefined7 *)&(pvVar9->_maximum).field_0x1 = uVar3;
  (pvVar9->_maximum)._val = sVar2;
  (pvVar9->_minimum)._isUnbound = bVar4;
  *(undefined7 *)&(pvVar9->_minimum).field_0x1 = uVar5;
  (pvVar9->_minimum)._val = sVar1;
  pSVar8 = ShapeConstraint::channelRange
                     ((ShapeConstraint *)
                      outranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b8,
                      __n_00);
  bVar4 = (pSVar8->_minimum)._isUnbound;
  uVar5 = *(undefined7 *)&(pSVar8->_minimum).field_0x1;
  sVar1 = (pSVar8->_minimum)._val;
  uVar3 = *(undefined7 *)&(pSVar8->_maximum).field_0x1;
  sVar2 = (pSVar8->_maximum)._val;
  (pvVar9->_maximum)._isUnbound = (pSVar8->_maximum)._isUnbound;
  *(undefined7 *)&(pvVar9->_maximum).field_0x1 = uVar3;
  (pvVar9->_maximum)._val = sVar2;
  (pvVar9->_minimum)._isUnbound = bVar4;
  *(undefined7 *)&(pvVar9->_minimum).field_0x1 = uVar5;
  (pvVar9->_minimum)._val = sVar1;
  pSVar8 = ShapeConstraint::heightRange
                     ((ShapeConstraint *)
                      outranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b8,
                      __n_01);
  bVar4 = (pSVar8->_minimum)._isUnbound;
  uVar5 = *(undefined7 *)&(pSVar8->_minimum).field_0x1;
  sVar1 = (pSVar8->_minimum)._val;
  uVar3 = *(undefined7 *)&(pSVar8->_maximum).field_0x1;
  sVar2 = (pSVar8->_maximum)._val;
  (pvVar9->_maximum)._isUnbound = (pSVar8->_maximum)._isUnbound;
  *(undefined7 *)&(pvVar9->_maximum).field_0x1 = uVar3;
  (pvVar9->_maximum)._val = sVar2;
  (pvVar9->_minimum)._isUnbound = bVar4;
  *(undefined7 *)&(pvVar9->_minimum).field_0x1 = uVar5;
  (pvVar9->_minimum)._val = sVar1;
  pSVar8 = ShapeConstraint::widthRange
                     ((ShapeConstraint *)
                      outranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b8,
                      __n_02);
  pSVar6 = ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  bVar4 = (pSVar8->_minimum)._isUnbound;
  uVar5 = *(undefined7 *)&(pSVar8->_minimum).field_0x1;
  sVar1 = (pSVar8->_minimum)._val;
  uVar3 = *(undefined7 *)&(pSVar8->_maximum).field_0x1;
  sVar2 = (pSVar8->_maximum)._val;
  (pvVar9->_maximum)._isUnbound = (pSVar8->_maximum)._isUnbound;
  *(undefined7 *)&(pvVar9->_maximum).field_0x1 = uVar3;
  (pvVar9->_maximum)._val = sVar2;
  (pvVar9->_minimum)._isUnbound = bVar4;
  *(undefined7 *)&(pvVar9->_minimum).field_0x1 = uVar5;
  (pvVar9->_minimum)._val = sVar1;
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b8,0)
  ;
  ShapeConstraint::updateSequenceRange((ShapeConstraint *)pSVar6,pvVar9);
  pSVar6 = ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b8,1)
  ;
  ShapeConstraint::updateChannelRange((ShapeConstraint *)pSVar6,pvVar9);
  pSVar6 = ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b8,2)
  ;
  ShapeConstraint::updateHeightRange((ShapeConstraint *)pSVar6,pvVar9);
  pSVar6 = ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar9 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                     ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b8,3)
  ;
  ShapeConstraint::updateWidthRange((ShapeConstraint *)pSVar6,pvVar9);
  pSVar6 = ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pSVar8 = ShapeConstraint::batchRange
                     ((ShapeConstraint *)
                      outranges.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)pSVar6,pSVar8);
  std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::~vector
            ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b8);
  Specification::PermuteLayerParams::~PermuteLayerParams((PermuteLayerParams *)&axis0);
  std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::~vector
            ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_38);
  return;
}

Assistant:

void NeuralNetworkShaper::shapePermuteLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];

    std::vector<ShapeRange> ranges(4);
    ranges[0] = inputShape.sequenceRange();
    ranges[1] = inputShape.channelRange();
    ranges[2] = inputShape.heightRange();
    ranges[3] = inputShape.widthRange();

    Specification::PermuteLayerParams permute = specLayer.permute();
    size_t axis0 = static_cast<size_t>(permute.axis(0));
    size_t axis1 = static_cast<size_t>(permute.axis(1));
    size_t axis2 = static_cast<size_t>(permute.axis(2));
    size_t axis3 = static_cast<size_t>(permute.axis(3));

    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Permute layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Permute layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.setName(specLayer.output(0));
    outputShape.updateSequenceRange(ranges[axis0]);
    outputShape.updateChannelRange(ranges[axis1]);
    outputShape.updateHeightRange(ranges[axis2]);
    outputShape.updateWidthRange(ranges[axis3]);

    // Need for the reverse pass as well
    std::vector<ShapeRange> outranges(4);
    outranges[axis0] = outputShape.sequenceRange();
    outranges[axis1] = outputShape.channelRange();
    outranges[axis2] = outputShape.heightRange();
    outranges[axis3] = outputShape.widthRange();

    // Need the constraints to go both ways here
    inputShape.updateSequenceRange(outranges[0]);
    inputShape.updateChannelRange(outranges[1]);
    inputShape.updateHeightRange(outranges[2]);
    inputShape.updateWidthRange(outranges[3]);

    inputShape.updateBatchRange(outputShape.batchRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Permute layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Permute layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif
    
}